

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileWatcher.cpp
# Opt level: O1

void __thiscall
wmj::fileWatcher::fileWatcher::fileWatcher
          (fileWatcher *this,string *fileName,function<void_()> *call_back)

{
  pointer pcVar1;
  int iVar2;
  
  this->_vptr_fileWatcher = (_func_int **)&PTR__fileWatcher_0011dd58;
  iVar2 = inotify_init();
  this->inotify_fd = iVar2;
  (this->file_name)._M_dataplus._M_p = (pointer)&(this->file_name).field_2;
  pcVar1 = (fileName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->file_name,pcVar1,pcVar1 + fileName->_M_string_length);
  this->need_watching = true;
  *(undefined8 *)&(this->call_back_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->call_back_func).super__Function_base._M_functor + 8) = 0;
  (this->call_back_func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->call_back_func)._M_invoker = (_Invoker_type)0x0;
  std::function<void_()>::operator=(&this->call_back_func,call_back);
  return;
}

Assistant:

fileWatcher::fileWatcher(const std::string &fileName,
                         const std::function<void(void)> &call_back):
    inotify_fd(inotify_init()), file_name(fileName), need_watching(true) {
    this->call_back_func = call_back;
}